

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_false>::fix_
          (DaTrie<false,_false,_false> *this,uint32_t node_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *in_RDX;
  uint in_ESI;
  DaTrie<false,_false,_false> *in_RDI;
  DaTrie<false,_false,_false> *in_stack_00000010;
  uint32_t prev;
  uint32_t next;
  uint32_t block_pos;
  
  while( true ) {
    uVar2 = num_blocks((DaTrie<false,_false,_false> *)0x15aa81);
    if (in_ESI >> 8 < uVar2) break;
    push_block_(in_stack_00000010);
  }
  uVar3 = (ulong)in_ESI;
  sVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(&in_RDI->bc_);
  if (uVar3 < sVar4) {
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)in_ESI);
    bVar1 = Bc::is_fixed(pvVar5);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!bc_[node_pos].is_fixed()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                    ,0x41b,
                    "void ddd::DaTrie<false, false, false>::fix_(uint32_t, std::vector<Block> &) [WithBLM = false, WithNLM = false, Prefix = false]"
                   );
    }
    in_RDI->bc_emps_ = in_RDI->bc_emps_ - 1;
    pvVar6 = std::vector<ddd::Block,_std::allocator<ddd::Block>_>::operator[]
                       (in_RDX,(ulong)(in_ESI >> 8));
    pvVar6->num_emps = pvVar6->num_emps - 1;
    if (in_RDI->bc_emps_ == 0) {
      in_RDI->head_pos_ = 0xffffffff;
    }
    else {
      if (in_ESI == in_RDI->head_pos_) {
        uVar2 = next_(in_RDI,(uint32_t)(uVar3 >> 0x20));
        in_RDI->head_pos_ = uVar2;
      }
      next_(in_RDI,(uint32_t)(uVar3 >> 0x20));
      prev_(in_RDI,(uint32_t)(uVar3 >> 0x20));
      set_next_(in_RDI,(uint32_t)(uVar3 >> 0x20),(uint32_t)uVar3);
      set_prev_(in_RDI,(uint32_t)(uVar3 >> 0x20),(uint32_t)uVar3);
    }
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)in_ESI);
    Bc::fix(pvVar5);
    return;
  }
  __assert_fail("node_pos < bc_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x41a,
                "void ddd::DaTrie<false, false, false>::fix_(uint32_t, std::vector<Block> &) [WithBLM = false, WithNLM = false, Prefix = false]"
               );
}

Assistant:

void fix_(uint32_t node_pos, std::vector<Block>& blocks) {
    auto block_pos = node_pos / BLOCK_SIZE;
    while (num_blocks() <= block_pos) {
      push_block_();
    }

    assert(node_pos < bc_.size());
    assert(!bc_[node_pos].is_fixed());

    --bc_emps_;
    --blocks[block_pos].num_emps;

    if (bc_emps_ == 0) {
      head_pos_ = NOT_FOUND;
    } else {
      if (node_pos == head_pos_) {
        head_pos_ = next_(head_pos_);
      }
      auto next = next_(node_pos);
      auto prev = prev_(node_pos);
      set_next_(prev, next);
      set_prev_(next, prev);
    }
    bc_[node_pos].fix();
  }